

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

XFontStruct * __thiscall Am_Font_Data::Get_X_Font(Am_Font_Data *this,Am_Drawonable_Impl *d)

{
  undefined2 uVar1;
  Display *dpy;
  bool bVar2;
  short sVar3;
  Display *pDVar4;
  XFontStruct *font_info;
  XFontStruct *xfont;
  XFontStruct *local_28;
  XFontStruct *local_20;
  
  dpy = d->screen->display;
  if (dpy == this->main_display) {
    local_20 = this->main_xfont;
  }
  else {
    pDVar4 = dpy;
    bVar2 = Get_Font(this,dpy,&local_20);
    if (!bVar2) {
      if (this->name == (char *)0x0) {
        initialize_standard_font(dpy,(int)pDVar4,this,&local_28);
      }
      else {
        initialize_font_from_file(dpy,(int)pDVar4,this->name,&local_28);
      }
      local_20 = local_28;
      if (this->main_display == (Display *)0x0) {
        this->main_display = dpy;
        this->main_xfont = local_28;
        uVar1 = (local_28->min_bounds).width;
        sVar3 = 0;
        if (uVar1 == (local_28->max_bounds).width) {
          sVar3 = uVar1;
        }
        this->char_width = (int)sVar3;
      }
      else {
        Add_Font(this,dpy,local_28);
      }
    }
  }
  return local_20;
}

Assistant:

XFontStruct *
Am_Font_Data::Get_X_Font(const Am_Drawonable_Impl *d)
{
  Display *disp = d->Get_Display();
  XFontStruct *xfont;
  if (disp == main_display)
    return main_xfont;
  else if (Get_Font(disp, xfont))
    return xfont;
  else {
    XFontStruct *font_info;
    const char *font_name = Get_Font_Name();
    if (font_name == nullptr)
      initialize_standard_font(disp, d->screen->screen_number, this,
                               &font_info);
    else
      initialize_font_from_file(disp, d->screen->screen_number, font_name,
                                &font_info);

    if (main_display)
      Add_Font(disp, font_info);
    else {
      main_display = disp;
      main_xfont = font_info;
      // set char_width for fixed width fonts, on main display only
      char_width = (font_info->min_bounds.width == font_info->max_bounds.width)
                       ? font_info->min_bounds.width
                       : 0;
    }

    return font_info;
  }
}